

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam_header.c
# Opt level: O2

char * stringify_argv(int argc,char **argv)

{
  char cVar1;
  size_t sVar2;
  char *pcVar3;
  char *pcVar4;
  long lVar5;
  char cVar6;
  ulong uVar7;
  ulong uVar8;
  size_t __size;
  
  uVar7 = 0;
  uVar8 = (ulong)(uint)argc;
  if (argc < 1) {
    uVar8 = uVar7;
  }
  __size = 1;
  for (; uVar8 != uVar7; uVar7 = uVar7 + 1) {
    sVar2 = strlen(argv[uVar7]);
    __size = __size + sVar2 + 1;
  }
  pcVar3 = (char *)malloc(__size);
  if (pcVar3 != (char *)0x0) {
    pcVar4 = pcVar3;
    for (uVar7 = 0; lVar5 = 1, uVar7 != uVar8; uVar7 = uVar7 + 1) {
      while( true ) {
        cVar1 = argv[uVar7][lVar5 + -1];
        cVar6 = ' ';
        if ((cVar1 != '\t') && (cVar6 = cVar1, cVar1 == '\0')) break;
        pcVar4[lVar5 + -1] = cVar6;
        lVar5 = lVar5 + 1;
      }
      pcVar4[lVar5 + -1] = ' ';
      pcVar4 = pcVar4 + lVar5;
    }
    *pcVar4 = '\0';
  }
  return pcVar3;
}

Assistant:

char *stringify_argv(int argc, char *argv[]) {
    char *str, *cp;
    size_t nbytes = 1;
    int i, j;

    /* Allocate */
    for (i = 0; i < argc; i++) {
	nbytes += strlen(argv[i]) + 1;
    }
    if (!(str = malloc(nbytes)))
	return NULL;

    /* Copy */
    cp = str;
    for (i = 0; i < argc; i++) {
	j = 0;
	while (argv[i][j]) {
	    if (argv[i][j] == '\t')
		*cp++ = ' ';
	    else
		*cp++ = argv[i][j];
	    j++;
	}
	*cp++ = ' ';
    }
    *cp++ = 0;

    return str;
}